

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall
SQCompilation::SQParser::Expression(SQParser *this,SQExpressionContext expression_context)

{
  SQExpressionContext SVar1;
  long lVar2;
  TerExpr *args;
  Expr *pEVar3;
  Expr *args_2;
  TreeOp args_00;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  SVar1 = this->_expression_context;
  this->_expression_context = expression_context;
  args = (TerExpr *)LogicalNullCoalesceExp(this);
  lVar2 = this->_token;
  if (((lVar2 - 0x119U < 0x27) && ((0x7000000301U >> (lVar2 - 0x119U & 0x3f) & 1) != 0)) ||
     (lVar2 == 0x3d)) {
    Lex(this);
    pEVar3 = Expression(this,SQE_RVALUE);
    if (lVar2 == 0x3d) {
      args_00 = TO_ASSIGN;
      if (expression_context - SQE_IF < 6) {
        reportDiagnostic(this,0x1e,
                         &DAT_0016df30 +
                         *(int *)(&DAT_0016df30 + (ulong)(expression_context - SQE_IF) * 4));
      }
    }
    else if (lVar2 == 0x119) {
      args_00 = TO_NEWSLOT;
    }
    else if (lVar2 == 0x121) {
      args_00 = TO_PLUSEQ;
    }
    else if (lVar2 == 0x122) {
      args_00 = TO_MINUSEQ;
    }
    else if (lVar2 == 0x13d) {
      args_00 = TO_MULEQ;
    }
    else if (lVar2 == 0x13e) {
      args_00 = TO_DIVEQ;
    }
    else {
      if (lVar2 != 0x13f) goto LAB_001540d0;
      args_00 = TO_MODEQ;
    }
    args = (TerExpr *)
           newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                     (this,args_00,(Expr *)args,pEVar3);
  }
  else if (lVar2 == 0x3f) {
    Lex(this);
    pEVar3 = Expression(this,SQE_RVALUE);
    Expect(this,0x3a);
    args_2 = Expression(this,SQE_RVALUE);
    args = newNode<SQCompilation::TerExpr,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Expr*>
                     (this,(Expr *)args,pEVar3,args_2);
  }
LAB_001540d0:
  this->_expression_context = SVar1;
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return &args->super_Expr;
}

Assistant:

Expr* SQParser::Expression(SQExpressionContext expression_context)
{
    NestingChecker nc(this);
    SQExpressionContext saved_expression_context = _expression_context;
    _expression_context = expression_context;

    Expr *expr = LogicalNullCoalesceExp();

    switch(_token)  {
    case _SC('='):
    case TK_NEWSLOT:
    case TK_MINUSEQ:
    case TK_PLUSEQ:
    case TK_MULEQ:
    case TK_DIVEQ:
    case TK_MODEQ: {
        SQInteger op = _token;
        Lex();
        Expr *e2 = Expression(SQE_RVALUE);

        switch (op) {
        case TK_NEWSLOT:
            expr = newNode<BinExpr>(TO_NEWSLOT, expr, e2);
            break;
        case _SC('='): //ASSIGN
            switch (expression_context)
            {
            case SQE_IF:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "if");
                break;
            case SQE_LOOP_CONDITION:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "loop condition");
                break;
            case SQE_SWITCH:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "switch");
                break;
            case SQE_FUNCTION_ARG:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "function argument");
                break;
            case SQE_RVALUE:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "expression");
                break;
            case SQE_ARRAY_ELEM:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "array element");
                break;
            case SQE_REGULAR:
                break;
            }
            expr = newNode<BinExpr>(TO_ASSIGN, expr, e2);
            break;
        case TK_MINUSEQ: expr = newNode<BinExpr>(TO_MINUSEQ, expr, e2); break;
        case TK_PLUSEQ: expr = newNode<BinExpr>(TO_PLUSEQ, expr, e2); break;
        case TK_MULEQ: expr = newNode<BinExpr>(TO_MULEQ, expr, e2); break;
        case TK_DIVEQ: expr = newNode<BinExpr>(TO_DIVEQ, expr, e2); break;
        case TK_MODEQ: expr = newNode<BinExpr>(TO_MODEQ, expr, e2); break;
        }
    }
    break;
    case _SC('?'): {
        Consume('?');

        Expr *ifTrue = Expression(SQE_RVALUE);

        Expect(_SC(':'));

        Expr *ifFalse = Expression(SQE_RVALUE);

        expr = newNode<TerExpr>(expr, ifTrue, ifFalse);
    }
    break;
    }

    _expression_context = saved_expression_context;
    return expr;
}